

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

vector<duckdb::Value,_true> *
duckdb::MacroExtractor::GetParameters
          (vector<duckdb::Value,_true> *__return_storage_ptr__,ScalarMacroCatalogEntry *entry,
          idx_t offset)

{
  pointer puVar1;
  reference this;
  type pMVar2;
  BaseExpression *this_00;
  ColumnRefExpression *this_01;
  string *__args;
  __node_base *p_Var3;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *param;
  pointer this_02;
  
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
         ::get<true>(&(entry->super_MacroCatalogEntry).macros,offset);
  pMVar2 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
           operator*(this);
  puVar1 = (pMVar2->parameters).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (pMVar2->parameters).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1; this_02 = this_02 + 1
      ) {
    this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_02)->super_BaseExpression;
    this_01 = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_00);
    __args = ColumnRefExpression::GetColumnName_abi_cxx11_(this_01);
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)__return_storage_ptr__,__args)
    ;
  }
  p_Var3 = &(pMVar2->default_parameters)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<Value> GetParameters(ScalarMacroCatalogEntry &entry, idx_t offset) {
		vector<Value> results;
		auto &macro_entry = *entry.macros[offset];
		for (auto &param : macro_entry.parameters) {
			D_ASSERT(param->GetExpressionType() == ExpressionType::COLUMN_REF);
			auto &colref = param->Cast<ColumnRefExpression>();
			results.emplace_back(colref.GetColumnName());
		}
		for (auto &param_entry : macro_entry.default_parameters) {
			results.emplace_back(param_entry.first);
		}
		return results;
	}